

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

int signo3(int A,int B)

{
  uint uVar1;
  undefined4 local_20;
  int i;
  int n;
  int tA2;
  int B_local;
  int A_local;
  
  i = 0;
  for (local_20 = 1; local_20 <= tp + tq; local_20 = local_20 + 1) {
    i = A >> ((byte)local_20 & 0x1f) ^ i;
  }
  uVar1 = (A & B) >> ((byte)tp & 0x1f) ^ B & i;
  uVar1 = (int)uVar1 >> 8 ^ uVar1;
  uVar1 = (int)uVar1 >> 4 ^ uVar1;
  uVar1 = (int)uVar1 >> 2 ^ uVar1;
  if ((((int)uVar1 >> 1 ^ uVar1) & 1) == 0) {
    B_local = 1;
  }
  else {
    B_local = -1;
  }
  return B_local;
}

Assistant:

int signo3(int A,int B)
{
	
	int tA2=0,n=(tp+tq); 
	for(int i=1;i<=n;i++)
		tA2^=(A>>i);

	tA2&=B;
	tA2^=(A&B)>>tp;
	tA2^=(tA2>>8);
	tA2^=(tA2>>4);
	tA2^=(tA2>>2);
	tA2^=(tA2>>1);
		
	if(tA2&1)return -1;
	return 1;
}